

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_point_triangle(rf_vec2 point,rf_vec2 p1,rf_vec2 p2,rf_vec2 p3)

{
  byte bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = p3.x;
  fVar6 = p3.y;
  fVar2 = point.x - fVar8;
  fVar3 = p1.x - fVar8;
  fVar7 = point.y - fVar6;
  fVar8 = fVar8 - p2.x;
  fVar4 = p2.y - fVar6;
  fVar5 = fVar4 * fVar3 + fVar8 * (p1.y - fVar6);
  fVar4 = (fVar4 * fVar2 + fVar8 * fVar7) / fVar5;
  if (fVar4 <= 0.0) {
    bVar1 = 0;
  }
  else {
    fVar5 = (fVar3 * fVar7 + (fVar6 - p1.y) * fVar2) / fVar5;
    bVar1 = -(fVar5 < 1.0 - fVar4) & -(0.0 < fVar5);
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool rf_check_collision_point_triangle(rf_vec2 point, rf_vec2 p1, rf_vec2 p2, rf_vec2 p3)
{
    bool collision = 0;

    float alpha = ((p2.y - p3.y) * (point.x - p3.x) + (p3.x - p2.x) * (point.y - p3.y)) /
                  ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float beta = ((p3.y - p1.y) * (point.x - p3.x) + (p1.x - p3.x) * (point.y - p3.y)) /
                 ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float gamma = 1.0f - alpha - beta;

    if ((alpha > 0) && (beta > 0) & (gamma > 0)) collision = 1;

    return collision;
}